

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

Abc_Cex_t *
Bmc_CexEssentialBitOne(Gia_Man_t *p,Abc_Cex_t *pCexState,int iBit,Abc_Cex_t *pCexPrev,int *pfEqual)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  int iVar3;
  Abc_Cex_t *p_00;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int local_4c;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x289,
                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                 );
  }
  if (pCexState->nBits <= iBit) {
    __assert_fail("iBit < pCexState->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x28a,
                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                 );
  }
  if (pfEqual != (int *)0x0) {
    *pfEqual = 0;
  }
  p_00 = Abc_CexAllocFull(0,p->vCis->nSize,pCexState->iFrame + 1);
  p_00->iFrame = pCexState->iFrame;
  p_00->iPo = pCexState->iPo;
  (&p_00[1].iPo)[iBit >> 5] = (&p_00[1].iPo)[iBit >> 5] ^ 1 << ((byte)iBit & 0x1f);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  uVar13 = (long)iBit / (long)pCexState->nPis;
  uVar9 = uVar13 & 0xffffffff;
  local_4c = (int)uVar13;
  if (local_4c <= pCexState->iFrame) {
    do {
      local_4c = local_4c + 1;
      pVVar5 = p->vCis;
      iVar3 = (int)uVar9;
      if (0 < pVVar5->nSize) {
        lVar12 = 0;
        do {
          lVar6 = (long)pVVar5->pArray[lVar12];
          if ((lVar6 < 0) || (p->nObjs <= pVVar5->pArray[lVar12])) goto LAB_00551c2b;
          pGVar1 = p->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          lVar7 = (ulong)(uint)(pCexState->nPis * iVar3) + lVar12;
          uVar9 = (ulong)(((uint)(&pCexState[1].iPo)[(int)lVar7 >> 5] >> ((byte)lVar7 & 0x1f) & 1)
                         << 0x1e);
          uVar13 = *(ulong *)(pGVar1 + lVar6);
          *(ulong *)(pGVar1 + lVar6) = uVar13 & 0xffffffffbfffffff | uVar9;
          uVar14 = pCexState->nPis * iVar3 + (int)lVar12;
          *(ulong *)(pGVar1 + lVar6) =
               uVar13 & 0xbfffffffbfffffff | uVar9 |
               (ulong)(((uint)(&p_00[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) != 0) << 0x3e
          ;
          lVar12 = lVar12 + 1;
          pVVar5 = p->vCis;
        } while (lVar12 < pVVar5->nSize);
      }
      if (0 < p->nObjs) {
        lVar12 = 0;
        lVar6 = 0;
        do {
          pGVar1 = p->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          uVar13 = *(ulong *)(&pGVar1->field_0x0 + lVar12);
          uVar14 = (uint)uVar13;
          if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            uVar10 = (uint)(uVar13 >> 0x1d) & 7 ^
                     *(uint *)((long)pGVar1 +
                              (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3 + lVar12) >> 0x1e;
            uVar15 = (uint)(uVar13 >> 0x1e);
            uVar8 = *(uint *)((long)pGVar1 + (ulong)(uVar15 & 0x7ffffffc) * -3 + lVar12) >> 0x1e & 1
            ;
            uVar17 = (uint)(uVar13 >> 0x3d) & 1;
            uVar19 = (uVar8 ^ uVar17) & uVar10;
            uVar9 = (ulong)(uVar19 << 0x1e);
            *(ulong *)(&pGVar1->field_0x0 + lVar12) = uVar13 & 0xffffffff3fffffff | uVar9;
            if (uVar19 == 0) {
              if (((uVar10 & 1) == 0) && (uVar8 == uVar17)) {
                uVar9 = *(ulong *)((long)pGVar1 + lVar12 + (ulong)(uVar15 & 0x7ffffffc) * -3) |
                        *(ulong *)((long)pGVar1 + lVar12 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3)
                ;
              }
              else {
                if ((uVar10 & 1) == 0) {
                  uVar15 = (uVar14 & 0x1fffffff) << 2;
                }
                else {
                  if (uVar8 != uVar17) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcCexTools.c"
                                  ,0x2aa,
                                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                                 );
                  }
                  uVar15 = uVar15 & 0x7ffffffc;
                }
                uVar9 = *(ulong *)((long)pGVar1 + lVar12 + (ulong)uVar15 * -3);
              }
              uVar13 = uVar13 & 0xbfffffff3fffffff | uVar9 & 0x4000000000000000;
            }
            else {
              uVar13 = uVar13 & 0xbfffffff3fffffff | uVar9 |
                       *(ulong *)((long)pGVar1 + lVar12 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3)
                       & 0x4000000000000000 &
                       *(ulong *)((long)pGVar1 + lVar12 + (ulong)(uVar15 & 0x7ffffffc) * -3);
            }
            *(ulong *)(&pGVar1->field_0x0 + lVar12) = uVar13;
          }
          lVar6 = lVar6 + 1;
          lVar12 = lVar12 + 0xc;
        } while (lVar6 < p->nObjs);
      }
      pVVar5 = p->vCos;
      if (0 < pVVar5->nSize) {
        lVar12 = 0;
        do {
          iVar4 = pVVar5->pArray[lVar12];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00551c2b;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar1 = p->pObjs + iVar4;
          uVar13 = *(ulong *)pGVar1;
          uVar9 = (ulong)((uint)uVar13 & 0x1fffffff);
          uVar16 = (ulong)(((uint)uVar13 * 2 ^ *(uint *)(pGVar1 + -uVar9)) & 0x40000000);
          *(ulong *)pGVar1 = uVar13 & 0xffffffffbfffffff | uVar16;
          *(ulong *)pGVar1 =
               uVar13 & 0xbfffffffbfffffff | uVar16 |
               *(ulong *)(pGVar1 + -uVar9) & 0x4000000000000000;
          lVar12 = lVar12 + 1;
          pVVar5 = p->vCos;
        } while (lVar12 < pVVar5->nSize);
      }
      if (iVar3 < pCexState->iFrame) {
        iVar4 = p->nRegs;
        bVar2 = false;
        uVar14 = (uint)(pCexPrev != (Abc_Cex_t *)0x0);
        if (0 < iVar4) {
          iVar11 = (pCexState->nPis * local_4c + p->vCis->nSize) - iVar4;
          iVar18 = 0;
          do {
            uVar15 = (pVVar5->nSize - iVar4) + iVar18;
            if (((int)uVar15 < 0) || (pVVar5->nSize <= (int)uVar15)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = pVVar5->pArray[uVar15];
            if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00551c2b:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar1 = p->pObjs + iVar4;
            if ((pCexPrev != (Abc_Cex_t *)0x0) && (uVar14 != 0)) {
              iVar4 = iVar18 + iVar11;
              uVar14 = ~((uint)(&pCexPrev[1].iPo)[iVar4 >> 5] >> ((byte)iVar4 & 0x1f) ^
                        (uint)(*(ulong *)pGVar1 >> 0x3e)) & 1;
            }
            if (((undefined1  [12])*pGVar1 & (undefined1  [12])0x4000000000000000) ==
                (undefined1  [12])0x0) {
              iVar4 = iVar18 + iVar11;
              bVar2 = true;
              (&p_00[1].iPo)[iVar4 >> 5] = (&p_00[1].iPo)[iVar4 >> 5] ^ 1 << ((byte)iVar4 & 0x1f);
            }
            iVar18 = iVar18 + 1;
            iVar4 = p->nRegs;
          } while (iVar18 < iVar4);
        }
        if ((!bVar2) || (uVar14 != 0)) {
          if (pfEqual != (int *)0x0) {
            *pfEqual = uVar14;
          }
          Abc_CexFree(p_00);
          return (Abc_Cex_t *)0x0;
        }
      }
      uVar9 = (ulong)(iVar3 + 1);
    } while (iVar3 < pCexState->iFrame);
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBitOne( Gia_Man_t * p, Abc_Cex_t * pCexState, int iBit, Abc_Cex_t * pCexPrev, int * pfEqual )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    assert( pCexState->nRegs == 0 );
    assert( iBit < pCexState->nBits );
    if ( pfEqual )
        *pfEqual = 0;
    // start the counter-example
    pNew = Abc_CexAllocFull( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // clean bit
    Abc_InfoXorBit( pNew->pData, iBit );
    // simulate the remaining frames
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = iBit / pCexState->nPis; i <= pCexState->iFrame; i++ )
    {
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCexState->pData, i * pCexState->nPis + k );
            pObj->fMark1 = Abc_InfoHasBit( pNew->pData,      i * pCexState->nPis + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }
        if ( i < pCexState->iFrame )
        {
            int fChanges  = 0;
            int fEqual    = (pCexPrev != NULL);
            int iBitShift = (i + 1) * pCexState->nPis + Gia_ManPiNum(p);
            Gia_ManForEachRi( p, pObj, k )
            {
                if ( fEqual && pCexPrev && (int)pObj->fMark1 != Abc_InfoHasBit(pCexPrev->pData, iBitShift + k) )
                    fEqual = 0;
                if ( !pObj->fMark1 )
                {
                    fChanges = 1;
                    Abc_InfoXorBit( pNew->pData, iBitShift + k );
                }
            }
            if ( !fChanges || fEqual )
            {
                if ( pfEqual )
                    *pfEqual = fEqual;
                Abc_CexFree( pNew );
                return NULL;
            }
        }
/*
        if ( i == 20 )
        {
            printf( "Frame %d : ", i );
            Gia_ManForEachRi( p, pObj, k )
                printf( "%d", pObj->fMark1 );
            printf( "\n" );
        }
*/
    }
    return pNew;
}